

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

KeyInfo * multiSelectOrderByKeyInfo(Parse *pParse,Select *p,int nExtra)

{
  uint uVar1;
  ExprList *pEVar2;
  sqlite3 *db;
  KeyInfo *pKVar3;
  CollSeq *pCVar4;
  Expr *pEVar5;
  ulong uVar6;
  ulong uVar7;
  ExprList_item *pEVar8;
  
  pEVar2 = p->pOrderBy;
  uVar1 = pEVar2->nExpr;
  db = pParse->db;
  pKVar3 = sqlite3KeyInfoAlloc(db,uVar1 + 1,1);
  if (pKVar3 != (KeyInfo *)0x0) {
    pEVar8 = pEVar2->a;
    uVar6 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pEVar5 = pEVar8->pExpr;
      if ((pEVar5->flags & 0x100) == 0) {
        pCVar4 = multiSelectCollSeq(pParse,p,(pEVar8->u).x.iOrderByCol - 1);
        if (pCVar4 == (CollSeq *)0x0) {
          pCVar4 = db->pDfltColl;
        }
        pEVar5 = sqlite3ExprAddCollateString(pParse,pEVar5,pCVar4->zName);
        pEVar8->pExpr = pEVar5;
      }
      else {
        pCVar4 = sqlite3ExprCollSeq(pParse,pEVar5);
      }
      pKVar3->aColl[uVar6] = pCVar4;
      pKVar3->aSortOrder[uVar6] = pEVar8->sortOrder;
      pEVar8 = pEVar8 + 1;
    }
  }
  return pKVar3;
}

Assistant:

static KeyInfo *multiSelectOrderByKeyInfo(Parse *pParse, Select *p, int nExtra){
  ExprList *pOrderBy = p->pOrderBy;
  int nOrderBy = p->pOrderBy->nExpr;
  sqlite3 *db = pParse->db;
  KeyInfo *pRet = sqlite3KeyInfoAlloc(db, nOrderBy+nExtra, 1);
  if( pRet ){
    int i;
    for(i=0; i<nOrderBy; i++){
      struct ExprList_item *pItem = &pOrderBy->a[i];
      Expr *pTerm = pItem->pExpr;
      CollSeq *pColl;

      if( pTerm->flags & EP_Collate ){
        pColl = sqlite3ExprCollSeq(pParse, pTerm);
      }else{
        pColl = multiSelectCollSeq(pParse, p, pItem->u.x.iOrderByCol-1);
        if( pColl==0 ) pColl = db->pDfltColl;
        pOrderBy->a[i].pExpr =
          sqlite3ExprAddCollateString(pParse, pTerm, pColl->zName);
      }
      assert( sqlite3KeyInfoIsWriteable(pRet) );
      pRet->aColl[i] = pColl;
      pRet->aSortOrder[i] = pOrderBy->a[i].sortOrder;
    }
  }

  return pRet;
}